

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::SetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat aContentFormat)

{
  type aUint32;
  OptionValue local_38;
  ContentFormat local_1c;
  Message *pMStack_18;
  ContentFormat aContentFormat_local;
  Message *this_local;
  
  local_1c = aContentFormat;
  pMStack_18 = this;
  this_local = (Message *)__return_storage_ptr__;
  aUint32 = utils::to_underlying<ot::commissioner::coap::ContentFormat>(aContentFormat);
  OptionValue::OptionValue(&local_38,aUint32);
  AppendOption(__return_storage_ptr__,this,kContentFormat,&local_38);
  OptionValue::~OptionValue(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Error SetContentFormat(ContentFormat aContentFormat)
    {
        return AppendOption(OptionType::kContentFormat, OptionValue{utils::to_underlying(aContentFormat)});
    }